

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

RayDifferential * __thiscall
pbrt::Transform::operator()
          (RayDifferential *__return_storage_ptr__,Transform *this,RayDifferential *r,Float *tMax)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined1 auVar7 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Point3<float> PVar8;
  Vector3<float> VVar9;
  Ray tr;
  Ray RStack_78;
  Ray local_48;
  
  RStack_78.o.super_Tuple3<pbrt::Point3,_float>.x =
       (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
  RStack_78.o.super_Tuple3<pbrt::Point3,_float>.y =
       (r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(r->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  uVar2 = (r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  RStack_78._20_8_ = *(undefined8 *)&(r->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  RStack_78.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar1;
  RStack_78.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar1 >> 0x20);
  RStack_78.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  RStack_78.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  operator()(&local_48,this,&RStack_78,tMax);
  auVar7 = (undefined1  [56])0x0;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       local_48.o.super_Tuple3<pbrt::Point3,_float>.z;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
       local_48.o.super_Tuple3<pbrt::Point3,_float>.x;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       local_48.o.super_Tuple3<pbrt::Point3,_float>.y;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       local_48.d.super_Tuple3<pbrt::Vector3,_float>.x;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       local_48.d.super_Tuple3<pbrt::Vector3,_float>.y;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       local_48.d.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->super_Ray).time = local_48.time;
  (__return_storage_ptr__->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (uintptr_t)
          local_48.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  __return_storage_ptr__->hasDifferentials = r->hasDifferentials;
  PVar8 = operator()(this,&r->rxOrigin);
  auVar3._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar7;
  uVar1 = vmovlps_avx(auVar3._0_16_);
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
       PVar8.super_Tuple3<pbrt::Point3,_float>.z;
  PVar8 = operator()(this,&r->ryOrigin);
  auVar4._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar7;
  uVar1 = vmovlps_avx(auVar4._0_16_);
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
       PVar8.super_Tuple3<pbrt::Point3,_float>.z;
  VVar9 = operator()(this,&r->rxDirection);
  auVar5._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  uVar1 = vmovlps_avx(auVar5._0_16_);
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar9 = operator()(this,&r->ryDirection);
  auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar7;
  uVar1 = vmovlps_avx(auVar6._0_16_);
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  return __return_storage_ptr__;
}

Assistant:

inline RayDifferential Transform::operator()(const RayDifferential &r,
                                             Float *tMax) const {
    Ray tr = (*this)(Ray(r), tMax);
    RayDifferential ret(tr.o, tr.d, tr.time, tr.medium);
    ret.hasDifferentials = r.hasDifferentials;
    ret.rxOrigin = (*this)(r.rxOrigin);
    ret.ryOrigin = (*this)(r.ryOrigin);
    ret.rxDirection = (*this)(r.rxDirection);
    ret.ryDirection = (*this)(r.ryDirection);
    return ret;
}